

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
  obj;
  code *local_b8;
  long local_88 [17];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
  ::CATCH2_INTERNAL_TEMPLATE_TEST_105
            ((CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
              *)0x8e7186);
  local_b8 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_88 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_b8 & 1) != 0) {
    local_b8 = *(code **)(local_b8 + *plVar1 + -1);
  }
  (*local_b8)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
  ::~CATCH2_INTERNAL_TEMPLATE_TEST_105
            ((CATCH2_INTERNAL_TEMPLATE_TEST_105<slang::SmallVector<(anonymous_namespace)::Constructable,_5UL>_>
              *)0x8e71ea);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }